

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O3

bool __thiscall
dxil_spv::SPIRVModule::Impl::query_builtin_shader_input(Impl *this,Id id,BuiltIn *builtin)

{
  const_iterator cVar1;
  Id local_c;
  
  local_c = id;
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv::BuiltIn>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_spv::BuiltIn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->id_to_builtin_input)._M_h,&local_c);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_spv::BuiltIn>,_false>._M_cur !=
      (__node_type *)0x0) {
    *builtin = *(BuiltIn *)
                ((long)cVar1.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spv::BuiltIn>,_false>
                       ._M_cur + 0xc);
  }
  return cVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_spv::BuiltIn>,_false>._M_cur
         != (__node_type *)0x0;
}

Assistant:

bool SPIRVModule::Impl::query_builtin_shader_input(spv::Id id, spv::BuiltIn *builtin) const
{
	auto itr = id_to_builtin_input.find(id);
	if (itr != id_to_builtin_input.end())
	{
		*builtin = itr->second;
		return true;
	}
	else
		return false;
}